

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O3

State * __thiscall
Problem::getStateFromBidNumbers
          (State *__return_storage_ptr__,Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  int numConflicts;
  vector<node,_std::allocator<node>_> *pvVar1;
  long lVar2;
  double cost;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_40,bidNos);
  if ((long)this->numCompanies < 1) {
    cost = 0.0;
    if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) goto LAB_00103234;
  }
  else {
    pvVar1 = this->problemData;
    cost = 0.0;
    lVar2 = 0;
    do {
      cost = cost + (pvVar1->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
                    super__Vector_impl_data._M_start
                    [local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar2]].price;
      lVar2 = lVar2 + 1;
      pvVar1 = pvVar1 + 1;
    } while (this->numCompanies != lVar2);
  }
  operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_00103234:
  std::vector<int,_std::allocator<int>_>::vector(&local_58,bidNos);
  numConflicts = getStateConflicts(this,&local_58);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_70,bidNos);
  State::State(__return_storage_ptr__,&local_70,cost,numConflicts);
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

State Problem::getStateFromBidNumbers(vector<int> bidNos) {
    // cout<<"Getting state"<<endl;
    double totalCost = getStateCost(bidNos);
    // cout<<"Cost: "<<to_string(totalCost)<<", ";
    int totalConflicts = getStateConflicts(bidNos);
    // cout<<"Conflicts: "<<totalConflicts<<endl;
    return State(bidNos, totalCost, totalConflicts);
}